

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_searcher.cc
# Opt level: O0

bool __thiscall
gss::innards::HomomorphismSearcher::propagate
          (HomomorphismSearcher *this,bool initial,Domains *new_domains,
          HomomorphismAssignments *assignments,bool propagate_using_lackey)

{
  bool bVar1;
  byte bVar2;
  reference pHVar3;
  pointer pHVar4;
  element_type *peVar5;
  HomomorphismAssignment *pHVar6;
  ulong __n;
  function<bool_(int,_int)> *this_00;
  function<bool_(int,_int)> *pfVar7;
  reference pvVar8;
  uint *puVar9;
  undefined8 in_RCX;
  vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
  *in_RDX;
  byte in_SIL;
  long *in_RDI;
  byte in_R8B;
  anon_class_32_4_334b817f deletion;
  uint i;
  vector<int,_std::allocator<int>_> find_domain;
  bool wipeout_2;
  VertexToVertexMapping mapping;
  int dcount;
  bool wipeout_1;
  optional<gss::innards::HomomorphismAssignment> current_assignment_1;
  iterator branch_domain;
  bool done_globals_at_least_once;
  anon_class_8_1_52b55ef0 find_unit_domain;
  bool wipeout;
  HomomorphismAssignment current_assignment;
  HomomorphismAssignmentInformation *a;
  iterator __end2;
  iterator __begin2;
  vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
  *__range2;
  function<bool_(int,_int)> *in_stack_00000528;
  undefined1 in_stack_00000536;
  undefined1 in_stack_00000537;
  VertexToVertexMapping *in_stack_00000538;
  Lackey *in_stack_00000540;
  undefined5 in_stack_fffffffffffffd38;
  undefined1 in_stack_fffffffffffffd3d;
  undefined1 in_stack_fffffffffffffd3e;
  undefined1 in_stack_fffffffffffffd3f;
  function<bool_(int,_int)> *in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd48;
  uint in_stack_fffffffffffffd4c;
  optional<gss::innards::HomomorphismAssignment> *in_stack_fffffffffffffd50;
  SVOBitset *in_stack_fffffffffffffd58;
  VertexToVertexMapping *in_stack_fffffffffffffd60;
  vector<int,_std::allocator<int>_> *this_01;
  undefined7 in_stack_fffffffffffffd68;
  undefined1 in_stack_fffffffffffffd6f;
  HomomorphismSearcher *in_stack_fffffffffffffd70;
  HomomorphismSearcher *in_stack_fffffffffffffd78;
  int v;
  HomomorphismModel *this_02;
  byte local_231;
  anon_class_16_2_7a006f80 *in_stack_fffffffffffffdd8;
  anon_class_8_1_79d63da6 *in_stack_fffffffffffffde0;
  Watches<gss::innards::HomomorphismAssignment,_gss::innards::HomomorphismAssignmentWatchTable>
  *in_stack_fffffffffffffde8;
  HomomorphismAssignment in_stack_fffffffffffffdf0;
  uint local_1e4;
  undefined1 local_1dd [32];
  byte local_1bd;
  uint local_1bc;
  undefined4 local_164;
  HomomorphismDomain *local_160;
  vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
  *local_158;
  byte *local_150;
  undefined8 local_148;
  HomomorphismAssignment local_140;
  byte local_135 [53];
  Domains *in_stack_ffffffffffffff00;
  HomomorphismAssignments *in_stack_ffffffffffffff08;
  optional<gss::innards::HomomorphismAssignment> *in_stack_ffffffffffffff10;
  HomomorphismSearcher *in_stack_ffffffffffffff18;
  __normal_iterator<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
  local_98;
  byte local_89;
  vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
  *local_88;
  vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
  *local_80;
  undefined1 *local_78;
  undefined8 local_70;
  uint local_64;
  uint in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  uint in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  __normal_iterator<gss::innards::HomomorphismAssignmentInformation_*,_std::vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>_>
  local_40;
  undefined8 local_38;
  byte local_29;
  undefined8 local_28;
  vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
  *local_20;
  byte local_11;
  byte local_1;
  
  local_11 = in_SIL & 1;
  local_29 = in_R8B & 1;
  local_28 = in_RCX;
  local_20 = in_RDX;
  if ((local_11 != 0) && (bVar1 = might_have_watches((HomomorphismParams *)0x176be6), bVar1)) {
    local_38 = local_28;
    local_40._M_current =
         (HomomorphismAssignmentInformation *)
         std::
         vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
         ::begin((vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                  *)CONCAT17(in_stack_fffffffffffffd3f,
                             CONCAT16(in_stack_fffffffffffffd3e,
                                      CONCAT15(in_stack_fffffffffffffd3d,in_stack_fffffffffffffd38))
                            ));
    std::
    vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
    ::end((vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
           *)CONCAT17(in_stack_fffffffffffffd3f,
                      CONCAT16(in_stack_fffffffffffffd3e,
                               CONCAT15(in_stack_fffffffffffffd3d,in_stack_fffffffffffffd38))));
    while (bVar1 = __gnu_cxx::
                   operator==<gss::innards::HomomorphismAssignmentInformation_*,_std::vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>_>
                             ((__normal_iterator<gss::innards::HomomorphismAssignmentInformation_*,_std::vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>_>
                               *)in_stack_fffffffffffffd40,
                              (__normal_iterator<gss::innards::HomomorphismAssignmentInformation_*,_std::vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>_>
                               *)CONCAT17(in_stack_fffffffffffffd3f,
                                          CONCAT16(in_stack_fffffffffffffd3e,
                                                   CONCAT15(in_stack_fffffffffffffd3d,
                                                            in_stack_fffffffffffffd38)))),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      pHVar3 = __gnu_cxx::
               __normal_iterator<gss::innards::HomomorphismAssignmentInformation_*,_std::vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>_>
               ::operator*(&local_40);
      local_64 = (pHVar3->assignment).pattern_vertex;
      in_stack_ffffffffffffffa0 = (pHVar3->assignment).target_vertex;
      in_stack_ffffffffffffffa4 = in_stack_ffffffffffffffa4 & 0xffffff;
      local_70 = local_28;
      local_80 = local_20;
      local_78 = &stack0xffffffffffffffa7;
      in_stack_ffffffffffffffa8 = local_64;
      in_stack_ffffffffffffffac = in_stack_ffffffffffffffa0;
      Watches<gss::innards::HomomorphismAssignment,gss::innards::HomomorphismAssignmentWatchTable>::
      propagate<gss::innards::HomomorphismSearcher::propagate(bool,std::vector<gss::innards::HomomorphismDomain,std::allocator<gss::innards::HomomorphismDomain>>&,gss::innards::HomomorphismAssignments&,bool)::__2,gss::innards::HomomorphismSearcher::propagate(bool,std::vector<gss::innards::HomomorphismDomain,std::allocator<gss::innards::HomomorphismDomain>>&,gss::innards::HomomorphismAssignments&,bool)::__3>
                (in_stack_fffffffffffffde8,in_stack_fffffffffffffdf0,in_stack_fffffffffffffde0,
                 in_stack_fffffffffffffdd8);
      if ((in_stack_ffffffffffffffa4 & 0x1000000) != 0) {
        local_1 = 0;
        goto LAB_001775c1;
      }
      __gnu_cxx::
      __normal_iterator<gss::innards::HomomorphismAssignmentInformation_*,_std::vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>_>
      ::operator++(&local_40);
    }
  }
  local_88 = local_20;
  local_89 = 0;
  local_98 = propagate::anon_class_8_1_52b55ef0::operator()
                       ((anon_class_8_1_52b55ef0 *)in_stack_fffffffffffffd58);
  while( true ) {
    std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
    ::end((vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
           *)CONCAT17(in_stack_fffffffffffffd3f,
                      CONCAT16(in_stack_fffffffffffffd3e,
                               CONCAT15(in_stack_fffffffffffffd3d,in_stack_fffffffffffffd38))));
    bVar1 = __gnu_cxx::
            operator==<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
                      ((__normal_iterator<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
                        *)in_stack_fffffffffffffd40,
                       (__normal_iterator<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
                        *)CONCAT17(in_stack_fffffffffffffd3f,
                                   CONCAT16(in_stack_fffffffffffffd3e,
                                            CONCAT15(in_stack_fffffffffffffd3d,
                                                     in_stack_fffffffffffffd38))));
    local_231 = 1;
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_231 = local_89 ^ 0xff;
    }
    if ((local_231 & 1) == 0) break;
    std::optional<gss::innards::HomomorphismAssignment>::optional
              ((optional<gss::innards::HomomorphismAssignment> *)0x176db9);
    std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
    ::end((vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
           *)CONCAT17(in_stack_fffffffffffffd3f,
                      CONCAT16(in_stack_fffffffffffffd3e,
                               CONCAT15(in_stack_fffffffffffffd3d,in_stack_fffffffffffffd38))));
    bVar1 = __gnu_cxx::
            operator==<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
                      ((__normal_iterator<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
                        *)in_stack_fffffffffffffd40,
                       (__normal_iterator<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
                        *)CONCAT17(in_stack_fffffffffffffd3f,
                                   CONCAT16(in_stack_fffffffffffffd3e,
                                            CONCAT15(in_stack_fffffffffffffd3d,
                                                     in_stack_fffffffffffffd38))));
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
      ::operator->(&local_98);
      __gnu_cxx::
      __normal_iterator<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
      ::operator->(&local_98);
      SVOBitset::find_first(in_stack_fffffffffffffd58);
      std::optional<gss::innards::HomomorphismAssignment>::operator=
                (in_stack_fffffffffffffd50,
                 (HomomorphismAssignment *)
                 CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      pHVar4 = __gnu_cxx::
               __normal_iterator<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
               ::operator->(&local_98);
      pHVar4->fixed = true;
      std::optional<gss::innards::HomomorphismAssignment>::operator*
                ((optional<gss::innards::HomomorphismAssignment> *)0x176e67);
      std::
      vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
      ::push_back((vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                   *)in_stack_fffffffffffffd40,
                  (value_type *)
                  CONCAT17(in_stack_fffffffffffffd3f,
                           CONCAT16(in_stack_fffffffffffffd3e,
                                    CONCAT15(in_stack_fffffffffffffd3d,in_stack_fffffffffffffd38))))
      ;
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 6));
      if (bVar1) {
        peVar5 = std::
                 __shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x176ed0);
        v = (int)((ulong)peVar5 >> 0x20);
        this_02 = (HomomorphismModel *)*in_RDI;
        std::optional<gss::innards::HomomorphismAssignment>::operator->
                  ((optional<gss::innards::HomomorphismAssignment> *)0x176efa);
        HomomorphismModel::pattern_vertex_for_proof_abi_cxx11_(this_02,v);
        std::optional<gss::innards::HomomorphismAssignment>::operator->
                  ((optional<gss::innards::HomomorphismAssignment> *)0x176f2b);
        HomomorphismModel::target_vertex_for_proof_abi_cxx11_(this_02,v);
        Proof::unit_propagating
                  ((Proof *)in_stack_fffffffffffffd40,
                   (NamedVertex *)
                   CONCAT17(in_stack_fffffffffffffd3f,
                            CONCAT16(in_stack_fffffffffffffd3e,
                                     CONCAT15(in_stack_fffffffffffffd3d,in_stack_fffffffffffffd38)))
                   ,(NamedVertex *)0x176f5f);
        std::
        pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x176f6e);
        std::
        pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x176f7b);
      }
      bVar1 = might_have_watches((HomomorphismParams *)0x176fd7);
      if (bVar1) {
        local_135[0] = 0;
        pHVar6 = std::optional<gss::innards::HomomorphismAssignment>::operator*
                           ((optional<gss::innards::HomomorphismAssignment> *)0x177008);
        local_140 = *pHVar6;
        local_148 = local_28;
        local_158 = local_20;
        local_150 = local_135;
        Watches<gss::innards::HomomorphismAssignment,gss::innards::HomomorphismAssignmentWatchTable>
        ::
        propagate<gss::innards::HomomorphismSearcher::propagate(bool,std::vector<gss::innards::HomomorphismDomain,std::allocator<gss::innards::HomomorphismDomain>>&,gss::innards::HomomorphismAssignments&,bool)::__4,gss::innards::HomomorphismSearcher::propagate(bool,std::vector<gss::innards::HomomorphismDomain,std::allocator<gss::innards::HomomorphismDomain>>&,gss::innards::HomomorphismAssignments&,bool)::__5>
                  (in_stack_fffffffffffffde8,in_stack_fffffffffffffdf0,in_stack_fffffffffffffde0,
                   in_stack_fffffffffffffdd8);
        if ((local_135[0] & 1) != 0) {
          local_1 = 0;
          goto LAB_001775c1;
        }
      }
      std::optional<gss::innards::HomomorphismAssignment>::operator*
                ((optional<gss::innards::HomomorphismAssignment> *)0x177098);
      bVar1 = propagate_simple_constraints
                        (in_stack_fffffffffffffd78,(Domains *)in_stack_fffffffffffffd70,
                         (HomomorphismAssignment *)
                         CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
      if (!bVar1) {
        local_1 = 0;
        goto LAB_001775c1;
      }
    }
    bVar1 = HomomorphismModel::has_less_thans((HomomorphismModel *)0x1770d0);
    if ((bVar1) &&
       (bVar1 = propagate_less_thans
                          ((HomomorphismSearcher *)
                           CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                           (Domains *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0))
       , !bVar1)) {
      local_1 = 0;
      goto LAB_001775c1;
    }
    bVar1 = HomomorphismModel::has_occur_less_thans((HomomorphismModel *)0x17710c);
    if ((bVar1) &&
       (bVar1 = propagate_occur_less_thans
                          (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                           in_stack_ffffffffffffff08,in_stack_ffffffffffffff00), !bVar1)) {
      local_1 = 0;
      goto LAB_001775c1;
    }
    if ((*(int *)(in_RDI[1] + 0x1c) == 0) &&
       (bVar1 = cheap_all_different((uint)in_stack_fffffffffffffd50,
                                    (vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                                     *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48)
                                    ,(shared_ptr<gss::innards::Proof> *)in_stack_fffffffffffffd40,
                                    (HomomorphismModel *)
                                    CONCAT17(in_stack_fffffffffffffd3f,
                                             CONCAT16(in_stack_fffffffffffffd3e,
                                                      CONCAT15(in_stack_fffffffffffffd3d,
                                                               in_stack_fffffffffffffd38)))), !bVar1
       )) goto code_r0x00177183;
    local_89 = 1;
    local_160 = (HomomorphismDomain *)
                propagate::anon_class_8_1_52b55ef0::operator()
                          ((anon_class_8_1_52b55ef0 *)in_stack_fffffffffffffd58);
    local_98 = (__normal_iterator<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
                )local_160;
  }
  local_164 = 0;
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<gss::innards::Lackey,_std::default_delete<gss::innards::Lackey>_> *
                     )0x1771e7);
  if ((!bVar1) || (((local_29 & 1) == 0 && ((*(byte *)(in_RDI[1] + 200) & 1) == 0))))
  goto LAB_001775b9;
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x177225)
  ;
  expand_to_full_result
            (in_stack_fffffffffffffd70,
             (HomomorphismAssignments *)
             CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),in_stack_fffffffffffffd60
            );
  if ((local_29 & 1) == 0) {
    std::unique_ptr<gss::innards::Lackey,_std::default_delete<gss::innards::Lackey>_>::operator->
              ((unique_ptr<gss::innards::Lackey,_std::default_delete<gss::innards::Lackey>_> *)
               0x177267);
    std::function<bool_(int,_int)>::function(in_stack_fffffffffffffd40);
    bVar1 = Lackey::check_solution
                      (in_stack_00000540,in_stack_00000538,(bool)in_stack_00000537,
                       (bool)in_stack_00000536,in_stack_00000528);
    bVar2 = bVar1 ^ 0xff;
    std::function<bool_(int,_int)>::~function((function<bool_(int,_int)> *)0x1772b9);
    if ((bVar2 & 1) == 0) goto LAB_00177581;
    local_1 = 0;
    local_1bc = 1;
  }
  else {
    local_1bd = 0;
    __n = (ulong)*(uint *)(*in_RDI + 0xc);
    local_1dd._1_4_ = 0xffffffff;
    this_01 = (vector<int,_std::allocator<int>_> *)local_1dd;
    std::allocator<int>::allocator((allocator<int> *)0x177357);
    std::vector<int,_std::allocator<int>_>::vector
              (this_01,__n,(value_type_conflict1 *)in_stack_fffffffffffffd50,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    std::allocator<int>::~allocator((allocator<int> *)local_1dd);
    local_1e4 = 0;
    while( true ) {
      this_00 = (function<bool_(int,_int)> *)(ulong)local_1e4;
      pfVar7 = (function<bool_(int,_int)> *)
               std::
               vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
               ::size(local_20);
      if (pfVar7 <= this_00) break;
      in_stack_fffffffffffffd4c = local_1e4;
      pvVar8 = std::
               vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
               ::operator[](local_20,(ulong)local_1e4);
      puVar9 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(local_1dd + 5),
                                  (ulong)pvVar8->v);
      *puVar9 = in_stack_fffffffffffffd4c;
      local_1e4 = local_1e4 + 1;
    }
    std::unique_ptr<gss::innards::Lackey,_std::default_delete<gss::innards::Lackey>_>::operator->
              ((unique_ptr<gss::innards::Lackey,_std::default_delete<gss::innards::Lackey>_> *)
               0x17747f);
    std::function<bool(int,int)>::
    function<gss::innards::HomomorphismSearcher::propagate(bool,std::vector<gss::innards::HomomorphismDomain,std::allocator<gss::innards::HomomorphismDomain>>&,gss::innards::HomomorphismAssignments&,bool)::__1&,void>
              (this_00,(anon_class_32_4_334b817f *)
                       CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    bVar1 = Lackey::check_solution
                      (in_stack_00000540,in_stack_00000538,(bool)in_stack_00000537,
                       (bool)in_stack_00000536,in_stack_00000528);
    bVar2 = local_1bd;
    if (!bVar1) {
      bVar2 = 1;
    }
    std::function<bool_(int,_int)>::~function((function<bool_(int,_int)> *)0x1774f3);
    bVar1 = (bVar2 & 1) != 0;
    if (bVar1) {
      local_1 = 0;
    }
    local_1bc = (uint)bVar1;
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
    if (local_1bc == 0) {
LAB_00177581:
      local_1bc = 0;
    }
  }
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x177599)
  ;
  if (local_1bc == 0) {
LAB_001775b9:
    local_1 = 1;
  }
LAB_001775c1:
  return (bool)(local_1 & 1);
code_r0x00177183:
  local_1 = 0;
  goto LAB_001775c1;
}

Assistant:

auto HomomorphismSearcher::propagate(bool initial, Domains & new_domains, HomomorphismAssignments & assignments, bool propagate_using_lackey) -> bool
{
    // nogoods might be watching things in initial assignments. this is possibly not the
    // best place to put this...
    if (initial && might_have_watches(params)) {
        for (auto & a : assignments.values) {
            HomomorphismAssignment current_assignment = {a.assignment.pattern_vertex, a.assignment.target_vertex};
            bool wipeout = false;
            watches.propagate(
                current_assignment,
                [&](const HomomorphismAssignment & a) { return ! assignments.contains(a); },
                [&](const HomomorphismAssignment & a) {
                    for (auto & d : new_domains) {
                        if (d.v == a.pattern_vertex) {
                            if (d.values.test(a.target_vertex)) {
                                d.values.reset(a.target_vertex);
                                if (0 == --d.count)
                                    wipeout = true;
                            }
                            break;
                        }
                    }
                });

            if (wipeout)
                return false;
        }
    }

    auto find_unit_domain = [&]() {
        return find_if(new_domains.begin(), new_domains.end(), [](HomomorphismDomain & d) {
            return (! d.fixed) && 1 == d.count;
        });
    };

    bool done_globals_at_least_once = false;

    // whilst we've got a unit domain...
    for (typename Domains::iterator branch_domain = find_unit_domain();
         branch_domain != new_domains.end() || ! done_globals_at_least_once;
         branch_domain = find_unit_domain()) {
        optional<HomomorphismAssignment> current_assignment;
        if (branch_domain != new_domains.end()) {
            // what are we assigning?
            current_assignment = HomomorphismAssignment{branch_domain->v, unsigned(branch_domain->values.find_first())};

            // ok, make the assignment
            branch_domain->fixed = true;
            assignments.values.push_back({*current_assignment, false, -1, -1});

            if (proof)
                proof->unit_propagating(
                    model.pattern_vertex_for_proof(current_assignment->pattern_vertex),
                    model.target_vertex_for_proof(current_assignment->target_vertex));

            // propagate watches
            if (might_have_watches(params)) {
                bool wipeout = false;
                watches.propagate(
                    *current_assignment,
                    [&](const HomomorphismAssignment & a) { return ! assignments.contains(a); },
                    [&](const HomomorphismAssignment & a) {
                        for (auto & d : new_domains) {
                            if (d.fixed)
                                continue;

                            if (d.v == a.pattern_vertex) {
                                if (d.values.test(a.target_vertex)) {
                                    d.values.reset(a.target_vertex);
                                    if (0 == --d.count)
                                        wipeout = true;
                                }
                                break;
                            }
                        }
                    });

                if (wipeout)
                    return false;
            }

            // propagate simple all different and adjacency
            if (! propagate_simple_constraints(new_domains, *current_assignment))
                return false;
        }

        // propagate less thans
        if (model.has_less_thans() && ! propagate_less_thans(new_domains))
            return false;
        if (model.has_occur_less_thans() && ! propagate_occur_less_thans(current_assignment, assignments, new_domains))
            return false;

        // propagate all different
        if (params.injectivity == Injectivity::Injective)
            if (! cheap_all_different(model.target_size, new_domains, proof, &model))
                return false;
        done_globals_at_least_once = true;
    }

    int dcount = 0;
    if (params.lackey && (propagate_using_lackey || params.send_partials_to_lackey)) {
        VertexToVertexMapping mapping;
        expand_to_full_result(assignments, mapping);

        if (! propagate_using_lackey) {
            if (! params.lackey->check_solution(mapping, true, false, Lackey::DeletionFunction{}))
                return false;
        }
        else {
            bool wipeout = false;
            vector<int> find_domain(model.pattern_size, -1);
            for (unsigned i = 0; i < new_domains.size(); ++i)
                find_domain[new_domains[i].v] = i;

            auto deletion = [&](int p, int t) -> bool {
                if (! wipeout) {
                    if (int d = find_domain[p]; d != -1) {
                        if (new_domains[d].values.test(t)) {
                            ++dcount;
                            new_domains[d].values.reset(t);
                            if (0 == --new_domains[d].count)
                                wipeout = true;
                            return true;
                        }
                    }
                }
                return false;
            };

            if (! params.lackey->check_solution(mapping, true, false, deletion) || wipeout)
                return false;
        }
    }

    return true;
}